

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.cpp
# Opt level: O2

KeyValues * __thiscall KV::KeyValues::get(KeyValues *this,string *name,size_t index)

{
  difference_type __d;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>_>
  pVar1;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>
  it;
  _Base_ptr local_18;
  
  pVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>,_KV::KeyValues::kvCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>_>
          ::equal_range(&(this->keyvalues)._M_t,name);
  local_18 = (_Base_ptr)pVar1.first._M_node;
  std::
  __advance<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::unique_ptr<KV::KeyValues,std::default_delete<KV::KeyValues>>>>,long>
            (&local_18,index,pVar1.second._M_node._M_node);
  return *(KeyValues **)(local_18 + 2);
}

Assistant:

KeyValues &KeyValues::get( const std::string &name, size_t index )
	{
		auto range = keyvalues.equal_range( name );

		auto it = range.first;
		std::advance( it, index );

		return *it->second;
	}